

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O0

utf16 __thiscall
GrcFont::GlyphFromPostscript(GrcFont *this,string *staPostscriptName,GdlObject *pgdlobj,bool fError)

{
  byte in_CL;
  long in_RDI;
  int nGlyphId;
  string *staMsg;
  GdlObject *in_stack_ffffffffffffff50;
  string local_a8 [4];
  int in_stack_ffffffffffffff5c;
  GrcErrorList *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  allocator local_49;
  string local_48 [32];
  int local_28;
  byte local_21;
  utf16 local_2;
  
  local_21 = in_CL & 1;
  staMsg = *(string **)(in_RDI + 0x70);
  std::__cxx11::string::c_str();
  local_28 = TtfUtil::PostLookup(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (local_28 < 0) {
    if ((local_21 & 1) != 0) {
      if (local_28 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,"Postscript name not found",&local_49);
        GrcErrorList::AddError
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                   staMsg);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
      }
      if (local_28 == -2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff80,"No Postscript name data in font",
                   (allocator *)&stack0xffffffffffffff7f);
        GrcErrorList::AddError
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                   staMsg);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
      }
      if (local_28 < -2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_a8,"Postscript name lookup error",(allocator *)&stack0xffffffffffffff57);
        GrcErrorList::AddError
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                   staMsg);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
      }
    }
    local_2 = 0;
  }
  else {
    local_2 = (utf16)local_28;
  }
  return local_2;
}

Assistant:

utf16 GrcFont::GlyphFromPostscript(std::string staPostscriptName, GdlObject * pgdlobj, bool fError)
{
	Assert(m_pFile);
	Assert(m_pPost);
	Assert(m_pMaxp);

	int nGlyphId = TtfUtil::PostLookup(m_pPost, m_cPost, m_pMaxp, staPostscriptName.c_str());
	if (nGlyphId >= 0)
		return nGlyphId;

	// calling method outputs invalid postscript name
	if (fError)
	{
		if (nGlyphId == -1)
			g_errorList.AddError(116, pgdlobj, "Postscript name not found");
		if (nGlyphId == -2)
			g_errorList.AddError(117, pgdlobj, "No Postscript name data in font");
		if (nGlyphId < -2)
			g_errorList.AddError(118, pgdlobj, "Postscript name lookup error");
	}
	return 0;

}